

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

string * __thiscall
cmCTest::Base64EncodeFile(string *__return_storage_ptr__,cmCTest *this,string *file)

{
  unsigned_long length;
  size_t sVar1;
  vector<char,_std::allocator<char>_> encoded_buffer;
  vector<char,_std::allocator<char>_> file_buffer;
  ifstream ifs;
  allocator_type local_251;
  vector<char,_std::allocator<char>_> local_250;
  vector<char,_std::allocator<char>_> local_238;
  char local_220 [520];
  
  length = cmsys::SystemTools::FileLength(file);
  std::ifstream::ifstream(local_220,(file->_M_dataplus)._M_p,_S_in);
  std::vector<char,_std::allocator<char>_>::vector
            (&local_238,length + 1,(allocator_type *)&local_250);
  std::istream::read(local_220,
                     (long)local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
  std::ifstream::close();
  std::vector<char,_std::allocator<char>_>::vector(&local_250,(length * 3 >> 1) + 5,&local_251);
  sVar1 = cmsysBase64_Encode((uchar *)local_238.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start,length,
                             (uchar *)local_250.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_start,1);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             local_250.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_250.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + sVar1);
  if ((uchar *)local_250.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_250.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_250.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((uchar *)local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::Base64EncodeFile(std::string const& file)
{
  size_t const len = cmSystemTools::FileLength(file);
  cmsys::ifstream ifs(file.c_str(), std::ios::in
#ifdef _WIN32
                        | std::ios::binary
#endif
                      );
  std::vector<char> file_buffer(len + 1);
  ifs.read(&file_buffer[0], len);
  ifs.close();

  std::vector<char> encoded_buffer((len * 3) / 2 + 5);

  size_t const rlen = cmsysBase64_Encode(
    reinterpret_cast<unsigned char*>(&file_buffer[0]), len,
    reinterpret_cast<unsigned char*>(&encoded_buffer[0]), 1);

  return std::string(&encoded_buffer[0], rlen);
}